

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O3

BreakpointProbeList * __thiscall Js::DebugDocument::GetBreakpointList(DebugDocument *this)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ArenaAllocator *alloc;
  undefined4 *puVar4;
  BreakpointProbeList *pBVar5;
  
  pBVar5 = this->m_breakpointList;
  if (pBVar5 == (BreakpointProbeList *)0x0) {
    this_00 = (this->utf8SourceInfo->m_scriptContext).ptr;
    if ((this_00 == (ScriptContext *)0x0) ||
       (iVar3 = (*(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_00),
       (char)iVar3 != '\0')) {
      pBVar5 = (BreakpointProbeList *)0x0;
    }
    else {
      alloc = ScriptContext::AllocatorForDiagnostics(this_00);
      if (alloc == (ArenaAllocator *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                    ,0x3a,"(diagnosticArena)","diagnosticArena");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        alloc = (ArenaAllocator *)0x0;
      }
      pBVar5 = (BreakpointProbeList *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
      (pBVar5->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      alloc = alloc;
      (pBVar5->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e1ec0;
      (pBVar5->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      buffer = (Type)0x0;
      (pBVar5->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count = 0;
      pBVar5->length = 0;
      pBVar5->increment = 4;
      this->m_breakpointList = pBVar5;
    }
  }
  return pBVar5;
}

Assistant:

BreakpointProbeList* DebugDocument::GetBreakpointList()
    {
        if (m_breakpointList != nullptr)
        {
            return m_breakpointList;
        }

        ScriptContext * scriptContext = this->utf8SourceInfo->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return nullptr;
        }

        ArenaAllocator* diagnosticArena = scriptContext->AllocatorForDiagnostics();
        Assert(diagnosticArena);

        m_breakpointList = this->NewBreakpointList(diagnosticArena);
        return m_breakpointList;
    }